

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O0

void __thiscall avro::json::JsonGenerator::encodeBool(JsonGenerator *this,bool b)

{
  byte bVar1;
  byte in_SIL;
  JsonGenerator *in_RDI;
  StreamWriter *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff0;
  JsonGenerator *b_00;
  
  bVar1 = in_SIL & 1;
  b_00 = in_RDI;
  sep((JsonGenerator *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff));
  if ((bVar1 & 1) == 0) {
    StreamWriter::writeBytes
              (unaff_retaddr,(uint8_t *)b_00,CONCAT17(bVar1,in_stack_fffffffffffffff0));
  }
  else {
    StreamWriter::writeBytes
              (unaff_retaddr,(uint8_t *)b_00,CONCAT17(bVar1,in_stack_fffffffffffffff0));
  }
  sep2(in_RDI);
  return;
}

Assistant:

void encodeBool(bool b) {
        sep();
        if (b) {
            out_.writeBytes(reinterpret_cast<const uint8_t*>("true"), 4);
        } else {
            out_.writeBytes(reinterpret_cast<const uint8_t*>("false"), 5);
        }
        sep2();
    }